

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testrunner.cpp
# Opt level: O1

Ref trun::TestRunner::GetCurrentTestModule(void)

{
  long lVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  element_type *in_RDI;
  undefined1 auVar3 [16];
  Ref RVar4;
  
  auVar3 = __tls_get_addr(&PTR_00228ac0);
  _Var2._M_pi = auVar3._8_8_;
  lVar1 = auVar3._0_8_;
  if (*(char *)(lVar1 + 0x20) == '\0') {
    GetCurrentTestModule();
    _Var2._M_pi = extraout_RDX;
  }
  in_RDI->_vptr_TestModule = *(_func_int ***)(lVar1 + 8);
  lVar1 = *(long *)(lVar1 + 0x10);
  *(long *)&in_RDI->state = lVar1;
  if (lVar1 != 0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)(lVar1 + 8) = *(int *)(lVar1 + 8) + 1;
      UNLOCK();
    }
    else {
      *(int *)(lVar1 + 8) = *(int *)(lVar1 + 8) + 1;
    }
  }
  RVar4.super___shared_ptr<trun::TestModule,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var2._M_pi;
  RVar4.super___shared_ptr<trun::TestModule,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (Ref)RVar4.super___shared_ptr<trun::TestModule,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

TestModule::Ref TestRunner::GetCurrentTestModule() {
    return threadContext.currentTestModule;
}